

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  bool bVar1;
  uint uVar2;
  uint col;
  uint in_ESI;
  ImVec2 *in_RDI;
  float fVar3;
  ImDrawList *unaff_retaddr;
  float r_surface;
  ImRect r;
  bool was_accepted_previously;
  ImGuiPayload *payload;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff58;
  byte local_99;
  char *in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_48;
  ImRect local_44;
  byte local_31;
  ImGuiPayload *local_30;
  ImGuiWindow *local_28;
  ImGuiContext *pIVar4;
  float in_stack_ffffffffffffffe8;
  ImVec2 *in_stack_fffffffffffffff8;
  
  local_28 = GImGui->CurrentWindow;
  local_30 = &GImGui->DragDropPayload;
  pIVar4 = GImGui;
  if ((in_RDI == (ImVec2 *)0x0) ||
     (bVar1 = ImGuiPayload::IsDataType
                        ((ImGuiPayload *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff68), bVar1)) {
    local_31 = pIVar4->DragDropAcceptIdPrev == pIVar4->DragDropTargetId;
    local_44.Min = (pIVar4->DragDropTargetRect).Min;
    local_44.Max = (pIVar4->DragDropTargetRect).Max;
    fVar3 = ImRect::GetWidth(&local_44);
    local_48 = ImRect::GetHeight(&local_44);
    local_48 = fVar3 * local_48;
    if (local_48 <= pIVar4->DragDropAcceptIdCurrRectSurface) {
      pIVar4->DragDropAcceptFlags = in_ESI;
      pIVar4->DragDropAcceptIdCurr = pIVar4->DragDropTargetId;
      pIVar4->DragDropAcceptIdCurrRectSurface = local_48;
    }
    local_30->Preview = (bool)(local_31 & 1);
    uVar2 = pIVar4->DragDropSourceFlags & 0x800;
    col = uVar2 | in_ESI;
    if ((uVar2 == 0 && (in_ESI & 0x800) == 0) && ((local_30->Preview & 1U) != 0)) {
      fVar3 = 3.5;
      ImVec2::ImVec2(&local_58,3.5,3.5);
      local_50 = operator-(in_stack_ffffffffffffff58,(ImVec2 *)0x1358fc);
      ImVec2::ImVec2(&local_68,fVar3,fVar3);
      local_60 = operator+(in_stack_ffffffffffffff58,(ImVec2 *)0x135933);
      GetColorU32((ImGuiCol)fVar3,in_stack_ffffffffffffff70);
      ImDrawList::AddRect(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,col,
                          in_stack_ffffffffffffffe8,(ImDrawFlags)((ulong)pIVar4 >> 0x20),
                          SUB84(pIVar4,0));
    }
    pIVar4->DragDropAcceptFrameCount = pIVar4->FrameCount;
    local_99 = 0;
    if ((local_31 & 1) != 0) {
      bVar1 = IsMouseDown(pIVar4->DragDropMouseButton);
      local_99 = bVar1 ^ 0xff;
    }
    local_30->Delivery = (bool)(local_99 & 1);
    if (((local_30->Delivery & 1U) == 0) && ((col & 0x400) == 0)) {
      local_30 = (ImGuiPayload *)0x0;
    }
  }
  else {
    local_30 = (ImGuiPayload *)0x0;
  }
  return local_30;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface <= g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    // FIXME-DRAGDROP: Settle on a proper default visuals for drop target.
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
        window->DrawList->AddRect(r.Min - ImVec2(3.5f,3.5f), r.Max + ImVec2(3.5f, 3.5f), GetColorU32(ImGuiCol_DragDropTarget), 0.0f, 0, 2.0f);

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}